

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
          (KNearestNeighborsClassifier *this)

{
  if (this->_oneof_case_[1] == 0x6e) {
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->DefaultClassLabel_).defaultstringlabel_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void KNearestNeighborsClassifier::clear_DefaultClassLabel() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.KNearestNeighborsClassifier)
  switch (DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      DefaultClassLabel_.defaultstringlabel_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kDefaultInt64Label: {
      // No need to clear
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = DEFAULTCLASSLABEL_NOT_SET;
}